

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O1

void __thiscall pbrt::HaltonPixelIndexer::SetPixel(HaltonPixelIndexer *this,Point2i *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  this->pixelSampleForIndex = 0;
  uVar4 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y *
          (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  if (1 < (int)uVar4) {
    lVar7 = this->pixelSampleForIndex;
    iVar1 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x;
    iVar2 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.y;
    lVar6 = 0;
    do {
      if (lVar6 == 0) {
        if (iVar1 < 1) {
          lVar9 = 0;
          goto LAB_004192d7;
        }
        lVar10 = 0;
        uVar5 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).x & 0x7f);
        iVar3 = iVar1;
        do {
          uVar8 = (uint)uVar5;
          uVar5 = uVar5 >> 1;
          lVar10 = (ulong)(uVar8 & 1) + lVar10 * 2;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        lVar9 = 0;
      }
      else {
        lVar9 = 4;
        if (iVar2 < 1) {
LAB_004192d7:
          lVar10 = 0;
        }
        else {
          lVar10 = 0;
          uVar5 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).y & 0x7f);
          iVar3 = iVar2;
          do {
            lVar10 = lVar10 * 3 + uVar5 % 3;
            iVar3 = iVar3 + -1;
            uVar5 = uVar5 / 3;
          } while (iVar3 != 0);
        }
      }
      lVar7 = lVar7 + this->multInverse[lVar6] * lVar10 *
                      (long)((int)uVar4 / *(int *)((long)this->multInverse + lVar9 + -0x10));
      bVar11 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar11);
    this->pixelSampleForIndex = lVar7 % (long)(ulong)uVar4;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void SetPixel(const Point2i &p) {
        pixelSampleForIndex = 0;

        int sampleStride = baseScales[0] * baseScales[1];
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse<2>(pm[i], baseExponents[i])
                             : InverseRadicalInverse<3>(pm[i], baseExponents[i]);
                pixelSampleForIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            pixelSampleForIndex %= sampleStride;
        }
    }